

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
LocalSupportVertexCallback::internalProcessTriangleIndex
          (LocalSupportVertexCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  long lVar6;
  btScalar bVar7;
  float fVar8;
  
  bVar7 = this->m_maxDot;
  fVar2 = (this->m_supportVecLocal).m_floats[0];
  fVar3 = (this->m_supportVecLocal).m_floats[1];
  fVar4 = (this->m_supportVecLocal).m_floats[2];
  lVar6 = 0;
  do {
    fVar8 = *(float *)((long)triangle->m_floats + lVar6 + 8) * fVar4 +
            *(float *)((long)triangle->m_floats + lVar6) * fVar2 +
            *(float *)((long)triangle->m_floats + lVar6 + 4) * fVar3;
    if (bVar7 < fVar8) {
      puVar1 = (undefined8 *)((long)triangle->m_floats + lVar6);
      this->m_maxDot = fVar8;
      uVar5 = puVar1[1];
      *(undefined8 *)(this->m_supportVertexLocal).m_floats = *puVar1;
      *(undefined8 *)((this->m_supportVertexLocal).m_floats + 2) = uVar5;
      bVar7 = fVar8;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x30);
  return;
}

Assistant:

virtual void internalProcessTriangleIndex(btVector3* triangle,int partId,int  triangleIndex)
	{
		(void)triangleIndex;
		(void)partId;

		for (int i=0;i<3;i++)
		{
			btScalar dot = m_supportVecLocal.dot(triangle[i]);
			if (dot > m_maxDot)
			{
				m_maxDot = dot;
				m_supportVertexLocal = triangle[i];
			}
		}
	}